

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O2

OneofGeneratorInfo * __thiscall
google::protobuf::compiler::java::Context::GetOneofGeneratorInfo
          (Context *this,OneofDescriptor *oneof)

{
  second_type *psVar1;
  LogMessage *pLVar2;
  LogMessage local_60 [56];
  OneofDescriptor *local_28;
  OneofDescriptor *oneof_local;
  
  local_28 = oneof;
  psVar1 = FindOrNull<std::map<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>>
                     (&this->oneof_generator_info_map_,&local_28);
  if (psVar1 == (second_type *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/compiler/java/java_context.cc"
               ,0xb9);
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_60,"Can not find OneofGeneratorInfo for oneof: ");
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<(pLVar2,*(string **)local_28);
    google::protobuf::internal::LogFinisher::operator=
              ((LogFinisher *)((long)&oneof_local + 7),pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(local_60);
  }
  return psVar1;
}

Assistant:

const OneofGeneratorInfo* Context::GetOneofGeneratorInfo(
    const OneofDescriptor* oneof) const {
  const OneofGeneratorInfo* result =
      FindOrNull(oneof_generator_info_map_, oneof);
  if (result == NULL) {
    GOOGLE_LOG(FATAL) << "Can not find OneofGeneratorInfo for oneof: "
               << oneof->name();
  }
  return result;
}